

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# augmentedmatrix.cpp
# Opt level: O3

bool __thiscall AugmentedMatrix::setAugmentData(AugmentedMatrix *this,fraction *values,int height)

{
  long lVar1;
  
  this->height = height;
  if (0 < height) {
    lVar1 = 0;
    do {
      *(unkbyte10 *)((long)this->augment + lVar1) = *(unkbyte10 *)((long)values + lVar1);
      lVar1 = lVar1 + 0x10;
    } while ((ulong)(uint)height << 4 != lVar1);
  }
  return true;
}

Assistant:

bool AugmentedMatrix::setAugmentData( fraction *values , int height)
{
    this->height = height;
    for( int i(0) ; i < this->height ; i++)
        augment[i]  = values[i];
    return true;
}